

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::ProcessObjs(SPAdapter *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pTVar4;
  SafeBool SVar5;
  CStringRef msg;
  Error *this_00;
  char *__s1;
  undefined8 uVar6;
  reference pvVar7;
  reference pvVar8;
  long in_RDI;
  double dVar9;
  iterator iVar10;
  Objective OVar11;
  value_type obj_1;
  int i_2;
  double constant;
  AffineExprExtractor extractor;
  CallExpr call;
  NumericExpr obj_expr;
  int core_var_index;
  const_iterator end_1;
  const_iterator i_1;
  LinearExpr *linear;
  vector<double,_std::allocator<double>_> core_obj;
  int num_vars;
  Objective obj;
  iterator end;
  iterator i;
  ObjRange objs;
  int num_stage1_vars;
  int num_objs;
  ExprBase in_stack_fffffffffffffdb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar12;
  int in_stack_fffffffffffffdcc;
  undefined4 uVar13;
  ExprBase in_stack_fffffffffffffdd0;
  ExprBase in_stack_fffffffffffffdd8;
  ExprBase in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffe04;
  Error *in_stack_fffffffffffffe08;
  CStringRef in_stack_fffffffffffffe10;
  int local_16c;
  Impl *local_160;
  AffineExprExtractor local_140;
  Impl *local_118;
  BasicCStringRef<char> local_110;
  ExprBase local_108;
  ExprBase local_100;
  Function local_f8;
  Impl *local_f0;
  ExprBase local_e0;
  ExprBase local_d8;
  BasicCStringRef<char> local_d0;
  int local_c4;
  Term *local_c0;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_b8;
  LinearExpr *local_b0;
  vector<double,_std::allocator<double>_> local_90;
  int local_74;
  BasicProblem<mp::BasicProblemParams<int>_> *local_70;
  int local_68;
  BasicProblem<mp::BasicProblemParams<int>_> *local_60;
  int local_58;
  ExprBase local_50;
  BasicProblem<mp::BasicProblemParams<int>_> *local_48;
  undefined8 local_40;
  BasicProblem<mp::BasicProblemParams<int>_> *local_38;
  int local_30;
  undefined4 uStack_2c;
  iterator local_28;
  BasicProblem<mp::BasicProblemParams<int>_> *local_18;
  value_type local_10;
  int local_c;
  
  local_c = BasicProblem<mp::BasicProblemParams<int>_>::num_objs
                      ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c7507);
  if (local_c != 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x158),0);
    local_10 = *pvVar3;
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
    ::reserve(in_stack_fffffffffffffdf0,
              CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_18 = (BasicProblem<mp::BasicProblemParams<int>_> *)
               BasicProblem<mp::BasicProblemParams<int>_>::objs
                         ((BasicProblem<mp::BasicProblemParams<int>_> *)
                          in_stack_fffffffffffffdb8.impl_);
    iVar10 = BasicProblem<mp::BasicProblemParams<int>_>::
             Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
             ::begin((Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                      *)0x1c757f);
    local_28.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
    problem_ = iVar10.item_.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_;
    local_28.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
    index_ = iVar10.item_.
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    iVar10 = BasicProblem<mp::BasicProblemParams<int>_>::
             Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
             ::end((Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                    *)in_stack_fffffffffffffdc0);
    local_38 = iVar10.item_.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_;
    local_30 = iVar10.item_.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    while( true ) {
      local_48 = local_38;
      local_40 = CONCAT44(uStack_2c,local_30);
      iVar10.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
      problem_._4_4_ = in_stack_fffffffffffffdcc;
      iVar10.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
      problem_._0_4_ = in_stack_fffffffffffffdc8;
      iVar10.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
      _8_8_ = in_stack_fffffffffffffdd0.impl_;
      bVar1 = BasicProblem<mp::BasicProblemParams<int>_>::
              Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              ::iterator::operator!=((iterator *)in_stack_fffffffffffffdc0,iVar10);
      if (!bVar1) break;
      BasicProblem<mp::BasicProblemParams<int>_>::
      Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::iterator::operator->(&local_28);
      local_50.impl_ =
           (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                   BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                                   );
      std::
      vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ::push_back((vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                   *)in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8.impl_);
      BasicProblem<mp::BasicProblemParams<int>_>::
      Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::iterator::operator++(&local_28);
    }
    OVar11 = BasicProblem<mp::BasicProblemParams<int>_>::obj
                       ((BasicProblem<mp::BasicProblemParams<int>_> *)
                        in_stack_fffffffffffffdd0.impl_,in_stack_fffffffffffffdcc);
    local_70 = OVar11.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_;
    local_68 = OVar11.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               index_;
    local_60 = local_70;
    local_58 = local_68;
    local_74 = SPAdapter::num_vars((SPAdapter *)0x1c7692);
    std::allocator<double>::allocator((allocator<double> *)0x1c76be);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0.impl_,
               (size_type)in_stack_fffffffffffffdd8.impl_,
               (allocator_type *)in_stack_fffffffffffffdd0.impl_);
    std::allocator<double>::~allocator((allocator<double> *)0x1c76ea);
    local_b0 = BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                              *)0x1c76f7);
    local_b8.m_ptr = (Term *)LinearExpr::begin((LinearExpr *)in_stack_fffffffffffffdb8.impl_);
    local_c0 = (Term *)LinearExpr::end((LinearExpr *)in_stack_fffffffffffffdb8.impl_);
    while (bVar1 = gch::operator!=((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                                   in_stack_fffffffffffffdc0,
                                   (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                                   in_stack_fffffffffffffdb8.impl_), bVar1) {
      pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                         ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1c77a0);
      iVar2 = LinearExpr::Term::var_index(pTVar4);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x138),(long)iVar2);
      local_c4 = *pvVar3;
      if (local_10 <= local_c4) {
        pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                           ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1c77f2);
        dVar9 = LinearExpr::Term::coef(pTVar4);
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          uVar6 = __cxa_allocate_exception(0x18);
          fmt::BasicCStringRef<char>::BasicCStringRef
                    (&local_d0,"second-stage variable outside of expectation in objective");
          Error::Error(in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,in_stack_fffffffffffffe04
                      );
          __cxa_throw(uVar6,&Error::typeinfo,Error::~Error);
        }
      }
      pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                         ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1c78e8);
      dVar9 = LinearExpr::Term::coef(pTVar4);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_c4);
      *pvVar8 = dVar9;
      gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(&local_b8);
    }
    local_d8.impl_ =
         (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                 BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    SVar5 = internal::ExprBase::operator_cast_to_function_pointer(&local_d8);
    if (SVar5 != 0) {
      local_f0 = local_d8.impl_;
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffdd0.impl_,
                 (type_conflict1)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      msg.data_ = (char *)Cast<mp::CallExpr>((Expr)in_stack_fffffffffffffdb8.impl_);
      local_e0.impl_ = (Impl *)msg.data_;
      this_00 = (Error *)internal::ExprBase::operator_cast_to_function_pointer(&local_e0);
      in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 & 0xffffff;
      if (this_00 != (Error *)0x0) {
        local_f8 = CallExpr::function((CallExpr *)in_stack_fffffffffffffdb8.impl_);
        __s1 = Function::name(&local_f8);
        iVar2 = strcmp(__s1,"expectation");
        in_stack_fffffffffffffe04 = CONCAT13(iVar2 == 0,(int3)in_stack_fffffffffffffe04);
      }
      if ((char)(in_stack_fffffffffffffe04 >> 0x18) != '\0') {
        iVar2 = CallExpr::num_args((CallExpr *)0x1c7a46);
        bVar1 = true;
        if (iVar2 == 1) {
          in_stack_fffffffffffffde0.impl_ =
               (Impl *)CallExpr::arg((CallExpr *)in_stack_fffffffffffffdb8.impl_,0);
          local_108.impl_ = in_stack_fffffffffffffde0.impl_;
          in_stack_fffffffffffffdd8.impl_ =
               (Impl *)Cast<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                                 ((Expr)in_stack_fffffffffffffdb8.impl_);
          local_100.impl_ = in_stack_fffffffffffffdd8.impl_;
          local_d8.impl_ = in_stack_fffffffffffffdd8.impl_;
          in_stack_fffffffffffffdd0.impl_ =
               (Impl *)internal::ExprBase::operator_cast_to_function_pointer(&local_d8);
          bVar1 = (AffineExprExtractor *)in_stack_fffffffffffffdd0.impl_ ==
                  (AffineExprExtractor *)0x0;
        }
        if (bVar1) {
          uVar6 = __cxa_allocate_exception(0x18);
          uVar12 = (undefined4)uVar6;
          uVar13 = (undefined4)((ulong)uVar6 >> 0x20);
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_110,"invalid arguments to expectation")
          ;
          Error::Error(this_00,msg,in_stack_fffffffffffffe04);
          __cxa_throw(CONCAT44(uVar13,uVar12),&Error::typeinfo,Error::~Error);
        }
        BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x1c7b6a);
        pvVar7 = std::
                 vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                 ::operator[]((vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                               *)(in_RDI + 0x230),0);
        (pvVar7->super_ExprBase).impl_ = local_118;
      }
      internal::AffineExprExtractor::AffineExprExtractor
                ((AffineExprExtractor *)in_stack_fffffffffffffdd0.impl_,
                 (SPAdapter *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 in_stack_fffffffffffffdc0);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffdd0.impl_,
                 (type_conflict1)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
                (_num_stage1_vars,(Expr)this);
      dVar9 = internal::AffineExprExtractor::constant(&local_140);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                  ((BasicExprFactory<std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),dVar9);
        BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (NumericConstant)in_stack_fffffffffffffdd0.impl_,
                   (type_conflict1)((ulong)dVar9 >> 0x20));
        pvVar7 = std::
                 vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                 ::operator[]((vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                               *)(in_RDI + 0x230),0);
        (pvVar7->super_ExprBase).impl_ = local_160;
      }
      internal::AffineExprExtractor::~AffineExprExtractor((AffineExprExtractor *)0x1c7cc8);
    }
    for (local_16c = 0; local_16c < local_74; local_16c = local_16c + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_16c);
      if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
        LinearExpr::AddTerm((LinearExpr *)in_stack_fffffffffffffde0.impl_,
                            (int)((ulong)in_stack_fffffffffffffdd8.impl_ >> 0x20),
                            (double)in_stack_fffffffffffffdd0.impl_);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0.impl_);
  }
  return;
}

Assistant:

void SPAdapter::ProcessObjs() {
  int num_objs = problem_.num_objs();
  if (num_objs == 0)
    return;
  int num_stage1_vars = num_stage_vars_[0];
  nonlinear_objs_.reserve(num_objs);
  auto objs = problem_.objs();
  for (auto i = objs.begin(), end = objs.end(); i != end; ++i)
    nonlinear_objs_.push_back(i->nonlinear_expr());
  // Strip expectation from the first objective.
  auto obj = problem_.obj(0);
  int num_vars = this->num_vars();
  std::vector<double> core_obj(num_vars);
  const auto &linear = obj.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i) {
    int core_var_index = var_orig2core_[i->var_index()];
    if (core_var_index >= num_stage1_vars && i->coef() != 0)
      throw Error("second-stage variable outside of expectation in objective");
    core_obj[core_var_index] = i->coef();
  }
  auto obj_expr = obj.nonlinear_expr();
  if (obj_expr) {
    auto call = Cast<CallExpr>(obj_expr);
    if (call && std::strcmp(call.function().name(), "expectation") == 0) {
      if (call.num_args() != 1 || !(obj_expr = Cast<NumericExpr>(call.arg(0))))
        throw Error("invalid arguments to expectation");
      nonlinear_objs_[0] = mp::NumericExpr();
    }
    internal::AffineExprExtractor extractor(*this, core_obj);
    extractor.Visit(obj_expr);
    if (auto constant = extractor.constant())
      nonlinear_objs_[0] = factory_.MakeNumericConstant(constant);
  }
  for (int i = 0; i < num_vars; ++i) {
    if (auto obj = core_obj[i])
      linear_obj_.AddTerm(i, obj);
  }
}